

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::HaveBuildTreeRPATH(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  char *pcVar2;
  cmLinkImplementationLibraries *pcVar3;
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"SKIP_BUILD_RPATH",&local_41);
  bVar1 = GetPropertyAsBool(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_40,"BUILD_RPATH",&local_41);
    pcVar2 = GetProperty(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (pcVar2 != (char *)0x0) {
      return true;
    }
    pcVar3 = GetLinkImplementationLibraries(this,config);
    if (pcVar3 != (cmLinkImplementationLibraries *)0x0) {
      return (pcVar3->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pcVar3->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::HaveBuildTreeRPATH(const std::string& config) const
{
  if (this->GetPropertyAsBool("SKIP_BUILD_RPATH")) {
    return false;
  }
  if (this->GetProperty("BUILD_RPATH")) {
    return true;
  }
  if (cmLinkImplementationLibraries const* impl =
        this->GetLinkImplementationLibraries(config)) {
    return !impl->Libraries.empty();
  }
  return false;
}